

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O3

void iadst8x8_low1_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  __m256i alVar4;
  __m256i alVar5;
  __m256i alVar6;
  __m256i alVar7;
  __m256i alVar8;
  __m256i alVar9;
  __m256i alVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  undefined1 auVar14 [32];
  __m256i alVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  
  lVar13 = (long)bit * 0x100;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x170);
  auVar19._4_4_ = uVar1;
  auVar19._0_4_ = uVar1;
  auVar19._8_4_ = uVar1;
  auVar19._12_4_ = uVar1;
  auVar19._16_4_ = uVar1;
  auVar19._20_4_ = uVar1;
  auVar19._24_4_ = uVar1;
  auVar19._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x250);
  auVar14._4_4_ = uVar1;
  auVar14._0_4_ = uVar1;
  auVar14._8_4_ = uVar1;
  auVar14._12_4_ = uVar1;
  auVar14._16_4_ = uVar1;
  auVar14._20_4_ = uVar1;
  auVar14._24_4_ = uVar1;
  auVar14._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x1a0);
  auVar16._4_4_ = uVar1;
  auVar16._0_4_ = uVar1;
  auVar16._8_4_ = uVar1;
  auVar16._12_4_ = uVar1;
  auVar16._16_4_ = uVar1;
  auVar16._20_4_ = uVar1;
  auVar16._24_4_ = uVar1;
  auVar16._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x220);
  auVar17._4_4_ = uVar1;
  auVar17._0_4_ = uVar1;
  auVar17._8_4_ = uVar1;
  auVar17._12_4_ = uVar1;
  auVar17._16_4_ = uVar1;
  auVar17._20_4_ = uVar1;
  auVar17._24_4_ = uVar1;
  auVar17._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x1e0);
  auVar18._4_4_ = uVar1;
  auVar18._0_4_ = uVar1;
  auVar18._8_4_ = uVar1;
  auVar18._12_4_ = uVar1;
  auVar18._16_4_ = uVar1;
  auVar18._20_4_ = uVar1;
  auVar18._24_4_ = uVar1;
  auVar18._28_4_ = uVar1;
  iVar12 = 1 << ((char)bit - 1U & 0x1f);
  auVar21._4_4_ = iVar12;
  auVar21._0_4_ = iVar12;
  auVar21._8_4_ = iVar12;
  auVar21._12_4_ = iVar12;
  auVar21._16_4_ = iVar12;
  auVar21._20_4_ = iVar12;
  auVar21._24_4_ = iVar12;
  auVar21._28_4_ = iVar12;
  auVar14 = vpmulld_avx2((undefined1  [32])*in,auVar14);
  auVar14 = vpaddd_avx2(auVar21,auVar14);
  alVar15 = (__m256i)vpsrad_avx2(auVar14,ZEXT416((uint)bit));
  auVar14 = vpmulld_avx2((undefined1  [32])*in,auVar19);
  auVar14 = vpsubd_avx2(auVar21,auVar14);
  auVar2 = vpsrad_avx2(auVar14,ZEXT416((uint)bit));
  auVar14 = vpmulld_avx2((undefined1  [32])alVar15,auVar16);
  auVar19 = vpmulld_avx2(auVar2,auVar17);
  auVar14 = vpaddd_avx2(auVar21,auVar14);
  auVar14 = vpaddd_avx2(auVar14,auVar19);
  auVar20 = ZEXT416((uint)bit);
  auVar3 = vpsrad_avx2(auVar14,auVar20);
  auVar14 = vpmulld_avx2((undefined1  [32])alVar15,auVar17);
  auVar19 = vpmulld_avx2(auVar16,auVar2);
  auVar14 = vpaddd_avx2(auVar21,auVar14);
  auVar14 = vpsubd_avx2(auVar14,auVar19);
  alVar4 = (__m256i)vpsrad_avx2(auVar14,auVar20);
  auVar14 = vpmulld_avx2((undefined1  [32])alVar15,auVar18);
  auVar16 = vpmulld_avx2(auVar2,auVar18);
  auVar14 = vpaddd_avx2(auVar21,auVar14);
  auVar19 = vpaddd_avx2(auVar16,auVar14);
  auVar17 = vpsrad_avx2(auVar19,auVar20);
  auVar14 = vpsubd_avx2(auVar14,auVar16);
  alVar5 = (__m256i)vpsrad_avx2(auVar14,auVar20);
  auVar14 = vpmulld_avx2(auVar3,auVar18);
  auVar16 = vpmulld_avx2((undefined1  [32])alVar4,auVar18);
  auVar14 = vpaddd_avx2(auVar14,auVar21);
  auVar19 = vpaddd_avx2(auVar14,auVar16);
  alVar6 = (__m256i)vpsrad_avx2(auVar19,ZEXT416((uint)bit));
  auVar14 = vpsubd_avx2(auVar14,auVar16);
  auVar14 = vpsrad_avx2(auVar14,ZEXT416((uint)bit));
  if (do_cols == 0) {
    iVar12 = 10;
    if (10 < bd) {
      iVar12 = bd;
    }
    iVar12 = 0x20 << ((byte)iVar12 & 0x1f);
    iVar11 = -iVar12;
    auVar22._4_4_ = iVar11;
    auVar22._0_4_ = iVar11;
    auVar22._8_4_ = iVar11;
    auVar22._12_4_ = iVar11;
    auVar22._16_4_ = iVar11;
    auVar22._20_4_ = iVar11;
    auVar22._24_4_ = iVar11;
    auVar22._28_4_ = iVar11;
    iVar12 = iVar12 + -1;
    auVar23._4_4_ = iVar12;
    auVar23._0_4_ = iVar12;
    auVar23._8_4_ = iVar12;
    auVar23._12_4_ = iVar12;
    auVar23._16_4_ = iVar12;
    auVar23._20_4_ = iVar12;
    auVar23._24_4_ = iVar12;
    auVar23._28_4_ = iVar12;
    iVar12 = (1 << ((byte)out_shift & 0x1f)) >> 1;
    auVar24._4_4_ = iVar12;
    auVar24._0_4_ = iVar12;
    auVar24._8_4_ = iVar12;
    auVar24._12_4_ = iVar12;
    auVar24._16_4_ = iVar12;
    auVar24._20_4_ = iVar12;
    auVar24._24_4_ = iVar12;
    auVar24._28_4_ = iVar12;
    auVar19 = vpaddd_avx2(auVar24,(undefined1  [32])alVar15);
    auVar16 = vpsubd_avx2(auVar24,auVar3);
    auVar19 = vpsrad_avx2(auVar19,ZEXT416((uint)out_shift));
    auVar16 = vpsrad_avx2(auVar16,ZEXT416((uint)out_shift));
    auVar19 = vpmaxsd_avx2(auVar19,auVar22);
    alVar15 = (__m256i)vpminsd_avx2(auVar19,auVar23);
    auVar19 = vpmaxsd_avx2(auVar16,auVar22);
    alVar7 = (__m256i)vpminsd_avx2(auVar19,auVar23);
    auVar19 = vpaddd_avx2(auVar24,(undefined1  [32])alVar6);
    auVar16 = vpsubd_avx2(auVar24,auVar17);
    auVar20 = ZEXT416((uint)out_shift);
    auVar19 = vpsrad_avx2(auVar19,auVar20);
    auVar16 = vpsrad_avx2(auVar16,auVar20);
    auVar19 = vpmaxsd_avx2(auVar19,auVar22);
    alVar6 = (__m256i)vpminsd_avx2(auVar19,auVar23);
    auVar19 = vpmaxsd_avx2(auVar16,auVar22);
    alVar8 = (__m256i)vpminsd_avx2(auVar19,auVar23);
    auVar19 = vpaddd_avx2(auVar24,(undefined1  [32])alVar5);
    auVar16 = vpsubd_avx2(auVar24,auVar14);
    auVar14 = vpsrad_avx2(auVar19,auVar20);
    auVar19 = vpsrad_avx2(auVar16,auVar20);
    auVar14 = vpmaxsd_avx2(auVar14,auVar22);
    alVar5 = (__m256i)vpminsd_avx2(auVar14,auVar23);
    auVar14 = vpmaxsd_avx2(auVar19,auVar22);
    alVar9 = (__m256i)vpminsd_avx2(auVar14,auVar23);
    auVar14 = vpaddd_avx2(auVar24,(undefined1  [32])alVar4);
    auVar19 = vpsubd_avx2(auVar24,auVar2);
    auVar14 = vpsrad_avx2(auVar14,ZEXT416((uint)out_shift));
    auVar19 = vpsrad_avx2(auVar19,ZEXT416((uint)out_shift));
    auVar14 = vpmaxsd_avx2(auVar14,auVar22);
    alVar4 = (__m256i)vpminsd_avx2(auVar14,auVar23);
    auVar14 = vpmaxsd_avx2(auVar19,auVar22);
    alVar10 = (__m256i)vpminsd_avx2(auVar14,auVar23);
  }
  else {
    auVar19 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    alVar7 = (__m256i)vpsubd_avx2(auVar19,auVar3);
    alVar8 = (__m256i)vpsubd_avx2(auVar19,auVar17);
    alVar9 = (__m256i)vpsubd_avx2(auVar19,auVar14);
    alVar10 = (__m256i)vpsubd_avx2(auVar19,auVar2);
  }
  *out = alVar15;
  out[1] = alVar7;
  out[2] = alVar6;
  out[3] = alVar8;
  out[4] = alVar5;
  out[5] = alVar9;
  out[6] = alVar4;
  out[7] = alVar10;
  return;
}

Assistant:

static void iadst8x8_low1_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                               int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi4 = _mm256_set1_epi32(cospi[4]);
  const __m256i cospi60 = _mm256_set1_epi32(cospi[60]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const __m256i kZero = _mm256_setzero_si256();
  __m256i u[8], x;

  // stage 0
  // stage 1
  // stage 2

  x = _mm256_mullo_epi32(in[0], cospi60);
  u[0] = _mm256_add_epi32(x, rnding);
  u[0] = _mm256_srai_epi32(u[0], bit);

  x = _mm256_mullo_epi32(in[0], cospi4);
  u[1] = _mm256_sub_epi32(kZero, x);
  u[1] = _mm256_add_epi32(u[1], rnding);
  u[1] = _mm256_srai_epi32(u[1], bit);

  // stage 3
  // stage 4
  __m256i temp1, temp2;
  temp1 = _mm256_mullo_epi32(u[0], cospi16);
  x = _mm256_mullo_epi32(u[1], cospi48);
  temp1 = _mm256_add_epi32(temp1, x);
  temp1 = _mm256_add_epi32(temp1, rnding);
  temp1 = _mm256_srai_epi32(temp1, bit);
  u[4] = temp1;

  temp2 = _mm256_mullo_epi32(u[0], cospi48);
  x = _mm256_mullo_epi32(u[1], cospi16);
  u[5] = _mm256_sub_epi32(temp2, x);
  u[5] = _mm256_add_epi32(u[5], rnding);
  u[5] = _mm256_srai_epi32(u[5], bit);

  // stage 5
  // stage 6
  temp1 = _mm256_mullo_epi32(u[0], cospi32);
  x = _mm256_mullo_epi32(u[1], cospi32);
  u[2] = _mm256_add_epi32(temp1, x);
  u[2] = _mm256_add_epi32(u[2], rnding);
  u[2] = _mm256_srai_epi32(u[2], bit);

  u[3] = _mm256_sub_epi32(temp1, x);
  u[3] = _mm256_add_epi32(u[3], rnding);
  u[3] = _mm256_srai_epi32(u[3], bit);

  temp1 = _mm256_mullo_epi32(u[4], cospi32);
  x = _mm256_mullo_epi32(u[5], cospi32);
  u[6] = _mm256_add_epi32(temp1, x);
  u[6] = _mm256_add_epi32(u[6], rnding);
  u[6] = _mm256_srai_epi32(u[6], bit);

  u[7] = _mm256_sub_epi32(temp1, x);
  u[7] = _mm256_add_epi32(u[7], rnding);
  u[7] = _mm256_srai_epi32(u[7], bit);

  // stage 7
  if (do_cols) {
    out[0] = u[0];
    out[1] = _mm256_sub_epi32(kZero, u[4]);
    out[2] = u[6];
    out[3] = _mm256_sub_epi32(kZero, u[2]);
    out[4] = u[3];
    out[5] = _mm256_sub_epi32(kZero, u[7]);
    out[6] = u[5];
    out[7] = _mm256_sub_epi32(kZero, u[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m256i clamp_lo_out = _mm256_set1_epi32(-(1 << (log_range_out - 1)));
    const __m256i clamp_hi_out =
        _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_avx2(u[0], u[4], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
    neg_shift_avx2(u[6], u[2], out + 2, out + 3, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
    neg_shift_avx2(u[3], u[7], out + 4, out + 5, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
    neg_shift_avx2(u[5], u[1], out + 6, out + 7, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
  }
}